

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_address_file_hash_dictionary_handler.c
# Opt level: O3

ion_err_t oafdict_find(ion_dictionary_t *dictionary,ion_predicate_t *predicate,
                      ion_dict_cursor_t **cursor)

{
  ion_predicate_type_t iVar1;
  ion_file_hashmap_t *hash_map;
  ion_dict_cursor_t *piVar2;
  ion_err_t iVar3;
  ion_oafdict_cursor_t *cursor_00;
  ion_predicate_t *__ptr;
  void *pvVar4;
  void *__dest;
  ion_dictionary_parent_t *piVar5;
  int location;
  int local_3c;
  size_t local_38;
  
  cursor_00 = (ion_oafdict_cursor_t *)malloc(0x38);
  *cursor = (ion_dict_cursor_t *)cursor_00;
  if (cursor_00 == (ion_oafdict_cursor_t *)0x0) {
    return '\x06';
  }
  (cursor_00->super).dictionary = dictionary;
  (cursor_00->super).status = '\x03';
  (cursor_00->super).destroy = oafdict_destroy_cursor;
  (cursor_00->super).next = oafdict_next;
  __ptr = (ion_predicate_t *)malloc(0x20);
  (cursor_00->super).predicate = __ptr;
  iVar1 = predicate->type;
  __ptr->type = iVar1;
  __ptr->destroy = predicate->destroy;
  switch(iVar1) {
  case '\0':
    hash_map = (ion_file_hashmap_t *)dictionary->instance;
    pvVar4 = malloc((long)(hash_map->super).record.key_size);
    (__ptr->statement).range.lower_bound = pvVar4;
    if (pvVar4 != (void *)0x0) {
      memcpy(pvVar4,(predicate->statement).range.lower_bound,(long)(hash_map->super).record.key_size
            );
      local_3c = -1;
      iVar3 = oafh_find_item_loc(hash_map,pvVar4,&local_3c);
      piVar2 = *cursor;
      if (iVar3 == '\x01') {
        piVar2->status = '\x01';
        return '\0';
      }
      piVar2->status = '\x02';
      *(int *)(piVar2 + 1) = local_3c;
      *(int *)&piVar2[1].field_0x4 = local_3c;
      return '\0';
    }
LAB_0010af69:
    free(__ptr);
    free(cursor_00);
    return '\x06';
  case '\x01':
    piVar5 = dictionary->instance;
    pvVar4 = malloc((long)(piVar5->record).key_size);
    (__ptr->statement).range.lower_bound = pvVar4;
    if (pvVar4 == (void *)0x0) goto LAB_0010af69;
    local_38 = (size_t)(piVar5->record).key_size;
    memcpy(pvVar4,(predicate->statement).range.lower_bound,local_38);
    __dest = malloc(local_38);
    (__ptr->statement).range.upper_bound = __dest;
    if (__dest == (void *)0x0) {
      free(pvVar4);
      goto LAB_0010af69;
    }
    memcpy(__dest,(predicate->statement).range.upper_bound,(long)(piVar5->record).key_size);
    break;
  case '\x02':
    piVar5 = dictionary->instance;
    break;
  case '\x03':
    goto LAB_0010af79;
  default:
    return '\x05';
  }
  (cursor_00->super).status = '\x02';
  cursor_00->first = piVar5[1].key_type - key_type_numeric_unsigned;
  cursor_00->current = -1;
  iVar3 = oafdict_scan(cursor_00);
  if (iVar3 == '\x01') {
    (*cursor)->status = '\x01';
  }
LAB_0010af79:
  return '\0';
}

Assistant:

ion_err_t
oafdict_find(
	ion_dictionary_t	*dictionary,
	ion_predicate_t		*predicate,
	ion_dict_cursor_t	**cursor
) {
	/* allocate memory for cursor */
	if ((*cursor = malloc(sizeof(ion_oafdict_cursor_t))) == NULL) {
		return err_out_of_memory;
	}

	(*cursor)->dictionary			= dictionary;
	(*cursor)->status				= cs_cursor_uninitialized;

	/* bind destroy method for cursor */
	(*cursor)->destroy				= oafdict_destroy_cursor;

	/* bind correct next function */
	(*cursor)->next					= oafdict_next;	/* this will use the correct value */

	/* allocate predicate */
	(*cursor)->predicate			= malloc(sizeof(ion_predicate_t));
	(*cursor)->predicate->type		= predicate->type;
	(*cursor)->predicate->destroy	= predicate->destroy;

	/* based on the type of predicate that is being used, need to create the correct cursor */
	switch (predicate->type) {
		case predicate_equality: {
			/* as this is an equality, need to malloc for key as well */
			if (((*cursor)->predicate->statement.equality.equality_value = malloc((((ion_file_hashmap_t *) dictionary->instance)->super.record.key_size))) == NULL) {
				free((*cursor)->predicate);
				free(*cursor);	/* cleanup */
				return err_out_of_memory;
			}

			/* copy across the key value as the predicate may be destroyed */
			memcpy((*cursor)->predicate->statement.equality.equality_value, predicate->statement.equality.equality_value, ((((ion_file_hashmap_t *) dictionary->instance)->super.record.key_size)));

			/* find the location of the first element as this is a straight equality */
			int location = cs_invalid_index;

			if (oafh_find_item_loc((ion_file_hashmap_t *) dictionary->instance, (*cursor)->predicate->statement.equality.equality_value, &location) == err_item_not_found) {
				(*cursor)->status = cs_end_of_results;
				return err_ok;
			}
			else {
				(*cursor)->status = cs_cursor_initialized;

				/* cast to specific instance type for conveniences of setup */
				ion_oafdict_cursor_t *oadict_cursor = (ion_oafdict_cursor_t *) (*cursor);

				/* the cursor is ready to be consumed */
				oadict_cursor->first	= location;

				oadict_cursor->current	= location;
				return err_ok;
			}

			break;
		}

		case predicate_range: {
			/* as this is a range, need to malloc lower bound key */
			if (((*cursor)->predicate->statement.range.lower_bound = malloc((((ion_file_hashmap_t *) dictionary->instance)->super.record.key_size))) == NULL) {
				free((*cursor)->predicate);
				free(*cursor);	/* cleanup */
				return err_out_of_memory;
			}

			/* copy across the key value as the predicate may be destroyed */
			memcpy((*cursor)->predicate->statement.range.lower_bound, predicate->statement.range.lower_bound, (((ion_file_hashmap_t *) dictionary->instance)->super.record.key_size));

			/* as this is a range, need to malloc upper bound key */
			if (((*cursor)->predicate->statement.range.upper_bound = malloc((((ion_file_hashmap_t *) dictionary->instance)->super.record.key_size))) == NULL) {
				free((*cursor)->predicate->statement.range.lower_bound);
				free((*cursor)->predicate);
				free(*cursor);	/* cleanup */
				return err_out_of_memory;
			}

			/* copy across the key value as the predicate may be destroyed */
			memcpy((*cursor)->predicate->statement.range.upper_bound, predicate->statement.range.upper_bound, (((ion_file_hashmap_t *) dictionary->instance)->super.record.key_size));
		}

		/* Range query will intentionally continue to all record code to get rid of duplicate statements. */
		case predicate_all_records: {
			ion_oafdict_cursor_t	*oafdict_cursor = (ion_oafdict_cursor_t *) (*cursor);
			ion_file_hashmap_t		*hash_map		= ((ion_file_hashmap_t *) dictionary->instance);

			(*cursor)->status		= cs_cursor_initialized;
			oafdict_cursor->first	= (hash_map->map_size) - 1;
			oafdict_cursor->current = -1;

			ion_err_t err = oafdict_scan(oafdict_cursor);

			if (cs_end_of_results == err) {
				(*cursor)->status = cs_end_of_results;
			}

			return err_ok;
			break;
		}

		case predicate_predicate: {
			break;
		}

		default: {
			return err_invalid_predicate;	/* * Invalid predicate supplied */
			break;
		}
	}

	return err_ok;
}